

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

void __thiscall chaiscript::detail::Any::Any(Any *this,Any *t_any)

{
  bool bVar1;
  pointer pDVar2;
  unique_ptr<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
  *in_RDI;
  pointer in_stack_ffffffffffffffb8;
  undefined1 local_28 [40];
  
  std::unique_ptr<chaiscript::detail::Any::Data,std::default_delete<chaiscript::detail::Any::Data>>
  ::unique_ptr<std::default_delete<chaiscript::detail::Any::Data>,void>(in_RDI);
  bVar1 = empty((Any *)0x274a6f);
  if (bVar1) {
    std::
    unique_ptr<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>::
    reset(in_RDI,in_stack_ffffffffffffffb8);
  }
  else {
    pDVar2 = std::
             unique_ptr<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
             ::operator->((unique_ptr<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
                           *)0x274a89);
    (*pDVar2->_vptr_Data[3])(local_28);
    std::
    unique_ptr<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>::
    operator=(in_RDI,(unique_ptr<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
                      *)in_stack_ffffffffffffffb8);
    std::
    unique_ptr<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>::
    ~unique_ptr(in_RDI);
  }
  return;
}

Assistant:

Any(const Any &t_any) 
        { 
          if (!t_any.empty())
          {
            m_data = t_any.m_data->clone(); 
          } else {
            m_data.reset();
          }
        }